

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O1

void __thiscall
bssl::anon_unknown_0::SSLVersionTest_SequenceNumber_Test::TestBody
          (SSLVersionTest_SequenceNumber_Test *this)

{
  UniquePtr<SSL> *out_client;
  UniquePtr<SSL> *out_server;
  internal iVar1;
  bool bVar2;
  int iVar3;
  ParamType *pPVar4;
  SSLVersionTest *this_00;
  char *pcVar5;
  pointer *__ptr;
  uint8_t byte;
  uint64_t client_write_seq;
  uint64_t server_read_seq;
  AssertionResult gtest_ar;
  uint64_t client_read_seq;
  uint64_t server_write_seq;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_d0;
  AssertHelper local_c8;
  undefined1 local_b9;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_b8;
  AssertHelper local_b0;
  undefined1 local_a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  _Alloc_hider local_78;
  size_type sStack_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  undefined8 local_58;
  undefined8 local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  undefined8 local_38;
  
  this_00 = &this->super_SSLVersionTest;
  pPVar4 = testing::WithParamInterface<bssl::(anonymous_namespace)::VersionParam>::GetParam();
  if ((pPVar4->ssl_method == is_dtls) && (bVar2 = SSLVersionTest::is_tls13(this_00), bVar2)) {
    return;
  }
  local_88._8_8_ = 0;
  local_68._8_8_ = 0;
  local_a8 = (undefined1  [8])0x0;
  pbStack_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_98._8_8_ = 0;
  local_88._M_allocated_capacity = 0;
  sStack_70 = 0;
  local_68._M_allocated_capacity = 0;
  local_58._0_4_ = 0;
  local_58._4_1_ = false;
  local_58._5_3_ = 0;
  out_client = &(this->super_SSLVersionTest).client_;
  out_server = &(this->super_SSLVersionTest).server_;
  bVar2 = (this->super_SSLVersionTest).shed_handshake_config_;
  pcVar5 = (char *)(ulong)bVar2;
  local_98._M_allocated_capacity = (size_type)&local_88;
  local_78._M_p = (pointer)&local_68;
  bVar2 = ConnectClientAndServer
                    (out_client,out_server,
                     (this->super_SSLVersionTest).client_ctx_._M_t.
                     super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                     (this->super_SSLVersionTest).server_ctx_._M_t.
                     super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                     (ClientConfig *)local_a8,bVar2);
  local_48 = CONCAT71(local_48._1_7_,bVar2);
  local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_p != &local_68) {
    operator_delete(local_78._M_p,local_68._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_allocated_capacity != &local_88) {
    operator_delete((void *)local_98._M_allocated_capacity,local_88._M_allocated_capacity + 1);
  }
  iVar1 = local_48._0_1_;
  if (local_48._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a8,(internal *)&local_48,(AssertionResult *)"Connect()","false",
               "true",pcVar5);
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0xaf0,(char *)local_a8);
    testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    if (local_a8 != (undefined1  [8])&local_98) {
      operator_delete((void *)local_a8,(ulong)(local_98._M_allocated_capacity + 1));
    }
    if (local_b8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_b8._M_head_impl + 8))();
    }
  }
  if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_40,local_40);
  }
  if (iVar1 == (internal)0x0) {
    return;
  }
  bVar2 = FlushNewSessionTickets
                    ((out_client->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,
                     (out_server->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
  local_48 = CONCAT71(local_48._1_7_,bVar2);
  local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar2) {
    testing::Message::Message((Message *)&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a8,(internal *)&local_48,
               (AssertionResult *)"FlushNewSessionTickets(client_.get(), server_.get())","false",
               "true",pcVar5);
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0xaf4,(char *)local_a8);
    testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    if (local_a8 != (undefined1  [8])&local_98) {
      operator_delete((void *)local_a8,(ulong)(local_98._M_allocated_capacity + 1));
    }
    if (local_b8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_b8._M_head_impl + 8))();
    }
  }
  if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_40,local_40);
  }
  if (!bVar2) {
    return;
  }
  local_48 = SSL_get_read_sequence
                       ((out_client->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                        _M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
  local_b8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       SSL_get_write_sequence
                 ((out_client->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                  super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
  local_b0.data_ =
       (AssertHelperData *)
       SSL_get_read_sequence
                 ((out_server->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                  super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
  local_38 = SSL_get_write_sequence
                       ((out_server->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                        _M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
  pPVar4 = testing::WithParamInterface<bssl::(anonymous_namespace)::VersionParam>::GetParam();
  if (pPVar4->ssl_method == is_dtls) {
    local_c8.data_._0_2_ = local_48._6_2_;
    local_d0._M_head_impl._0_4_ = 1;
    testing::internal::CmpHelperEQ<unsigned_short,int>
              ((internal *)local_a8,"EpochFromSequence(client_read_seq)","1",
               (unsigned_short *)&local_c8,(int *)&local_d0);
    if (local_a8[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_d0);
      if (pbStack_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = (pbStack_a0->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0xafd,pcVar5);
      testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
      testing::internal::AssertHelper::~AssertHelper(&local_c8);
      if (local_d0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_d0._M_head_impl + 8))();
      }
    }
    if (pbStack_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_a0,pbStack_a0);
    }
    local_c8.data_._0_2_ = local_b8._M_head_impl._6_2_;
    local_d0._M_head_impl._0_4_ = 1;
    testing::internal::CmpHelperEQ<unsigned_short,int>
              ((internal *)local_a8,"EpochFromSequence(client_write_seq)","1",
               (unsigned_short *)&local_c8,(int *)&local_d0);
    if (local_a8[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_d0);
      if (pbStack_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = (pbStack_a0->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0xafe,pcVar5);
      testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
      testing::internal::AssertHelper::~AssertHelper(&local_c8);
      if (local_d0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_d0._M_head_impl + 8))();
      }
    }
    if (pbStack_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_a0,pbStack_a0);
    }
    local_c8.data_._0_2_ = local_b0.data_._6_2_;
    local_d0._M_head_impl._0_4_ = 1;
    testing::internal::CmpHelperEQ<unsigned_short,int>
              ((internal *)local_a8,"EpochFromSequence(server_read_seq)","1",
               (unsigned_short *)&local_c8,(int *)&local_d0);
    if (local_a8[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_d0);
      if (pbStack_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = (pbStack_a0->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0xaff,pcVar5);
      testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
      testing::internal::AssertHelper::~AssertHelper(&local_c8);
      if (local_d0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_d0._M_head_impl + 8))();
      }
    }
    if (pbStack_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_a0,pbStack_a0);
    }
    local_c8.data_._0_2_ = local_38._6_2_;
    local_d0._M_head_impl._0_4_ = 1;
    testing::internal::CmpHelperEQ<unsigned_short,int>
              ((internal *)local_a8,"EpochFromSequence(server_write_seq)","1",
               (unsigned_short *)&local_c8,(int *)&local_d0);
    if (local_a8[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_d0);
      if (pbStack_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = (pbStack_a0->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0xb00,pcVar5);
      testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
      testing::internal::AssertHelper::~AssertHelper(&local_c8);
      if (local_d0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_d0._M_head_impl + 8))();
      }
    }
    if (pbStack_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_a0,pbStack_a0);
    }
    testing::internal::CmpHelperGT<unsigned_long,unsigned_long>
              ((internal *)local_a8,"client_write_seq","server_read_seq",(unsigned_long *)&local_b8,
               (unsigned_long *)&local_b0);
    if (local_a8[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_d0);
      if (pbStack_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = (pbStack_a0->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0xb03,pcVar5);
      testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
      testing::internal::AssertHelper::~AssertHelper(&local_c8);
      if (local_d0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_d0._M_head_impl + 8))();
      }
    }
    if (pbStack_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_a0,pbStack_a0);
    }
    testing::internal::CmpHelperGT<unsigned_long,unsigned_long>
              ((internal *)local_a8,"server_write_seq","client_read_seq",&local_38,&local_48);
    if (local_a8[0] != (internal)0x0) goto LAB_001734ad;
    testing::Message::Message((Message *)&local_d0);
    if (pbStack_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (pbStack_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0xb04,pcVar5);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
  }
  else {
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)local_a8,"client_write_seq","server_read_seq",(unsigned_long *)&local_b8,
               (unsigned_long *)&local_b0);
    if (local_a8[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_d0);
      if (pbStack_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = (pbStack_a0->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0xb07,pcVar5);
      testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
      testing::internal::AssertHelper::~AssertHelper(&local_c8);
      if (local_d0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_d0._M_head_impl + 8))();
      }
    }
    if (pbStack_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_a0,pbStack_a0);
    }
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)local_a8,"server_write_seq","client_read_seq",&local_38,&local_48);
    if (local_a8[0] != (internal)0x0) goto LAB_001734ad;
    testing::Message::Message((Message *)&local_d0);
    if (pbStack_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (pbStack_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0xb08,pcVar5);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_c8);
  if (local_d0._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_d0._M_head_impl + 8))();
  }
LAB_001734ad:
  if (pbStack_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_a0,pbStack_a0);
  }
  local_b9 = 0;
  iVar3 = SSL_write((SSL *)(out_client->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>
                           ._M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,&local_b9,1);
  local_d0._M_head_impl._0_4_ = iVar3;
  local_c8.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_a8,"SSL_write(client_.get(), &byte, 1)","1",(int *)&local_d0,
             (int *)&local_c8);
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d0);
    if (pbStack_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (pbStack_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0xb0d,pcVar5);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if (local_d0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_d0._M_head_impl + 8))();
    }
  }
  if (pbStack_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_a0,pbStack_a0);
  }
  iVar3 = SSL_read((SSL *)(out_server->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                          _M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                          super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,&local_b9,1);
  local_d0._M_head_impl._0_4_ = iVar3;
  local_c8.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_a8,"SSL_read(server_.get(), &byte, 1)","1",(int *)&local_d0,
             (int *)&local_c8);
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d0);
    if (pbStack_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (pbStack_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0xb0e,pcVar5);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if (local_d0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_d0._M_head_impl + 8))();
    }
  }
  if (pbStack_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_a0,pbStack_a0);
  }
  local_d0._M_head_impl = local_b8._M_head_impl + 1;
  local_c8.data_ =
       (AssertHelperData *)
       SSL_get_write_sequence
                 ((out_client->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                  super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_a8,"client_write_seq + 1","SSL_get_write_sequence(client_.get())",
             (unsigned_long *)&local_d0,(unsigned_long *)&local_c8);
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d0);
    if (pbStack_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (pbStack_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0xb12,pcVar5);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if (local_d0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_d0._M_head_impl + 8))();
    }
  }
  if (pbStack_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_a0,pbStack_a0);
  }
  local_d0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)&(local_b0.data_)->type + 1);
  local_c8.data_ =
       (AssertHelperData *)
       SSL_get_read_sequence
                 ((out_server->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                  super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_a8,"server_read_seq + 1","SSL_get_read_sequence(server_.get())",
             (unsigned_long *)&local_d0,(unsigned_long *)&local_c8);
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d0);
    if (pbStack_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (pbStack_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0xb13,pcVar5);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if (local_d0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_d0._M_head_impl + 8))();
    }
  }
  if (pbStack_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_a0,pbStack_a0);
  }
  return;
}

Assistant:

TEST_P(SSLVersionTest, SequenceNumber) {
  // TODO(crbug.com/42290608): Once |SSL_get_read_sequence| and
  // |SSL_get_write_sequence| are no longer implemented in DTLS 1.3, make this
  // test TLS-only and remove the DTLS cases. For now, since we still care about
  // their behavior in DTLS 1.2, continue testing this behavior.
  if (is_dtls() && is_tls13()) {
    return;
  }

  ASSERT_TRUE(Connect());

  // Drain any post-handshake messages to ensure there are no unread records
  // on either end.
  ASSERT_TRUE(FlushNewSessionTickets(client_.get(), server_.get()));

  uint64_t client_read_seq = SSL_get_read_sequence(client_.get());
  uint64_t client_write_seq = SSL_get_write_sequence(client_.get());
  uint64_t server_read_seq = SSL_get_read_sequence(server_.get());
  uint64_t server_write_seq = SSL_get_write_sequence(server_.get());

  if (is_dtls()) {
    // Both client and server must be at epoch 1.
    EXPECT_EQ(EpochFromSequence(client_read_seq), 1);
    EXPECT_EQ(EpochFromSequence(client_write_seq), 1);
    EXPECT_EQ(EpochFromSequence(server_read_seq), 1);
    EXPECT_EQ(EpochFromSequence(server_write_seq), 1);

    // The next record to be written should exceed the largest received.
    EXPECT_GT(client_write_seq, server_read_seq);
    EXPECT_GT(server_write_seq, client_read_seq);
  } else {
    // The next record to be written should equal the next to be received.
    EXPECT_EQ(client_write_seq, server_read_seq);
    EXPECT_EQ(server_write_seq, client_read_seq);
  }

  // Send a record from client to server.
  uint8_t byte = 0;
  EXPECT_EQ(SSL_write(client_.get(), &byte, 1), 1);
  EXPECT_EQ(SSL_read(server_.get(), &byte, 1), 1);

  // The client write and server read sequence numbers should have
  // incremented.
  EXPECT_EQ(client_write_seq + 1, SSL_get_write_sequence(client_.get()));
  EXPECT_EQ(server_read_seq + 1, SSL_get_read_sequence(server_.get()));
}